

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O2

CURLcode smtp_do(connectdata *conn,_Bool *done)

{
  curl_mimepart *part;
  uint *puVar1;
  undefined4 *puVar2;
  curl_slist *pcVar3;
  undefined8 *puVar4;
  _Bool _Var5;
  CURLcode CVar6;
  char *pcVar7;
  char *pcVar8;
  curl_off_t cVar9;
  char *pcVar10;
  bool bVar11;
  _Bool *p_Var12;
  char *pcVar13;
  char *pcVar14;
  long *plVar15;
  Curl_easy *pCVar16;
  char *local_68;
  char *address;
  hostname host;
  
  *done = false;
  pCVar16 = conn->data;
  pcVar7 = (pCVar16->set).str[6];
  if (pcVar7 != (char *)0x0) {
    CVar6 = Curl_urldecode(pCVar16,pcVar7,0,(char **)((long)(pCVar16->req).protop + 8),(size_t *)0x0
                           ,true);
    if (CVar6 != CURLE_OK) {
      return CVar6;
    }
    pCVar16 = conn->data;
  }
  (pCVar16->req).size = -1;
  Curl_pgrsSetUploadCounter(pCVar16,0);
  Curl_pgrsSetDownloadCounter(pCVar16,0);
  Curl_pgrsSetUploadSize(pCVar16,-1);
  Curl_pgrsSetDownloadSize(pCVar16,-1);
  pCVar16 = conn->data;
  puVar2 = (undefined4 *)(pCVar16->req).protop;
  if (((pCVar16->set).field_0x913 & 0x10) != 0) {
    *puVar2 = 1;
  }
  *done = false;
  pcVar3 = (pCVar16->set).mail_rcpt;
  *(curl_slist **)(puVar2 + 4) = pcVar3;
  *(undefined1 *)(puVar2 + 6) = 0;
  puVar2[7] = 0;
  *(undefined1 *)(puVar2 + 10) = 1;
  *(undefined8 *)(puVar2 + 8) = 2;
  if (((pCVar16->set).field_0x913 & 0x20) == 0) {
    if (pcVar3 != (curl_slist *)0x0 && (pCVar16->set).mimepost.kind != MIMEKIND_NONE) {
LAB_00132954:
      pcVar7 = (pCVar16->set).str[0x3b];
      if (pcVar7 == (char *)0x0) {
        pcVar7 = (*Curl_cstrdup)("<>");
        bVar11 = false;
      }
      else {
        address = (char *)0x0;
        host.name = (char *)0x0;
        host.dispname = (char *)0x0;
        host.rawalloc = (char *)0x0;
        host.encalloc = (char *)0x0;
        CVar6 = smtp_parse_address(conn,pcVar7,&address,&host);
        pcVar8 = address;
        if (CVar6 != CURLE_OK) {
          return CVar6;
        }
        if ((conn->proto).imapc.resptag[2] == '\0') {
          bVar11 = false;
        }
        else {
          bVar11 = true;
          if ((host.encalloc == (char *)0x0) && (_Var5 = Curl_is_ASCII_name(address), _Var5)) {
            _Var5 = Curl_is_ASCII_name(host.name);
            bVar11 = !_Var5;
          }
        }
        if (host.name == (char *)0x0) {
          pcVar7 = curl_maprintf("<%s>",pcVar8);
        }
        else {
          pcVar7 = curl_maprintf("<%s@%s>",pcVar8);
          Curl_free_idnconverted_hostname(&host);
        }
        (*Curl_cfree)(pcVar8);
      }
      if (pcVar7 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar8 = (pCVar16->set).str[0x3c];
      if ((pcVar8 == (char *)0x0) || ((conn->proto).ftpc.cwdcount == 0)) {
        local_68 = (char *)0x0;
      }
      else {
        if (*pcVar8 == '\0') {
          local_68 = (*Curl_cstrdup)("<>");
        }
        else {
          address = (char *)0x0;
          host.name = (char *)0x0;
          host.dispname = (char *)0x0;
          host.rawalloc = (char *)0x0;
          host.encalloc = (char *)0x0;
          CVar6 = smtp_parse_address(conn,pcVar8,&address,&host);
          if (CVar6 != CURLE_OK) {
            (*Curl_cfree)(pcVar7);
            return CVar6;
          }
          if (((!bVar11) && ((conn->proto).imapc.resptag[2] == '\x01')) &&
             ((host.encalloc != (char *)0x0 ||
              ((_Var5 = Curl_is_ASCII_name(address), !_Var5 ||
               (_Var5 = Curl_is_ASCII_name(host.name), !_Var5)))))) {
            bVar11 = true;
          }
          pcVar8 = address;
          if (host.name == (char *)0x0) {
            local_68 = curl_maprintf("<%s>",address);
          }
          else {
            (*Curl_cfree)(pcVar7);
            pcVar8 = address;
            local_68 = (char *)0x0;
            pcVar7 = curl_maprintf("<%s@%s>",address,host.name);
            Curl_free_idnconverted_hostname(&host);
          }
          (*Curl_cfree)(pcVar8);
          if (pcVar7 == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
        if (local_68 == (char *)0x0) {
          (*Curl_cfree)(pcVar7);
          return CURLE_OUT_OF_MEMORY;
        }
      }
      if ((pCVar16->set).mimepost.kind != MIMEKIND_NONE) {
        part = &(pCVar16->set).mimepost;
        puVar1 = &(pCVar16->set).mimepost.flags;
        *(byte *)puVar1 = (byte)*puVar1 & 0xfd;
        curl_mime_headers(part,(pCVar16->set).headers,0);
        CVar6 = Curl_mime_prepare_headers(part,(char *)0x0,(char *)0x0,MIMESTRATEGY_MAIL);
        if ((CVar6 != CURLE_OK) ||
           (((pcVar8 = Curl_checkheaders(conn,"Mime-Version"), pcVar8 == (char *)0x0 &&
             (CVar6 = Curl_mime_add_header(&(pCVar16->set).mimepost.curlheaders,"Mime-Version: 1.0")
             , CVar6 != CURLE_OK)) || (CVar6 = Curl_mime_rewind(part), CVar6 != CURLE_OK))))
        goto LAB_00132d30;
        cVar9 = Curl_mime_size(part);
        (pCVar16->state).infilesize = cVar9;
        (pCVar16->state).fread_func = Curl_mime_read;
        (pCVar16->state).in = part;
      }
      if (((conn->proto).imapc.resptag[1] == '\x01') && (0 < (pCVar16->state).infilesize)) {
        pcVar8 = curl_maprintf("%ld");
        CVar6 = CURLE_OUT_OF_MEMORY;
        if (pcVar8 == (char *)0x0) {
LAB_00132d30:
          (*Curl_cfree)(pcVar7);
          (*Curl_cfree)(local_68);
          return CVar6;
        }
      }
      else {
        pcVar8 = (char *)0x0;
      }
      if (((conn->proto).imapc.resptag[2] == '\x01') && (!bVar11)) {
        plVar15 = (long *)((long)(pCVar16->req).protop + 0x10);
        bVar11 = false;
        while ((puVar4 = (undefined8 *)*plVar15, puVar4 != (undefined8 *)0x0 && (!bVar11))) {
          _Var5 = Curl_is_ASCII_name((char *)*puVar4);
          if (!_Var5) {
            bVar11 = true;
          }
          plVar15 = puVar4 + 1;
        }
      }
      pcVar10 = " AUTH=";
      pcVar13 = local_68;
      if (local_68 == (char *)0x0) {
        pcVar10 = "";
        pcVar13 = "";
      }
      pcVar14 = " SIZE=";
      if (pcVar8 == (char *)0x0) {
        pcVar14 = "";
      }
      CVar6 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"MAIL FROM:%s%s%s%s%s%s",pcVar7,pcVar10,pcVar13,
                            pcVar14);
      (*Curl_cfree)(pcVar7);
      (*Curl_cfree)(local_68);
      (*Curl_cfree)(pcVar8);
      if (CVar6 != CURLE_OK) {
        return CVar6;
      }
      (conn->proto).imapc.state = IMAP_SELECT;
      goto LAB_0013292d;
    }
  }
  else if (pcVar3 != (curl_slist *)0x0) goto LAB_00132954;
  CVar6 = smtp_perform_command(conn);
  if (CVar6 != CURLE_OK) {
    return CVar6;
  }
LAB_0013292d:
  p_Var12 = done;
  CVar6 = smtp_multi_statemach(conn,done);
  if ((CVar6 == CURLE_OK) && (CVar6 = CURLE_OK, *done == true)) {
    smtp_dophase_done(conn,SUB81(p_Var12,0));
  }
  return CVar6;
}

Assistant:

static CURLcode smtp_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the custom request */
  result = smtp_parse_custom_request(conn);
  if(result)
    return result;

  result = smtp_regular_transfer(conn, done);

  return result;
}